

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void __thiscall fs::Path::Path(Path *this,string *path,string *separator)

{
  pointer pcVar1;
  pointer pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  char *pcVar4;
  allocator<char> local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)this,(string *)path);
  (this->_stem)._M_dataplus._M_p = (pointer)&(this->_stem).field_2;
  (this->_stem)._M_string_length = 0;
  (this->_stem).field_2._M_local_buf[0] = '\0';
  (this->_extension)._M_dataplus._M_p = (pointer)&(this->_extension).field_2;
  (this->_extension)._M_string_length = 0;
  (this->_extension).field_2._M_local_buf[0] = '\0';
  (this->_file)._M_dataplus._M_p = (pointer)&(this->_file).field_2;
  (this->_file)._M_string_length = 0;
  (this->_file).field_2._M_local_buf[0] = '\0';
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_path).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_fullpath)._M_dataplus._M_p = (pointer)&(this->_fullpath).field_2;
  (this->_fullpath)._M_string_length = 0;
  (this->_fullpath).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->_separator,(string *)separator);
  pcVar1 = (path->_M_dataplus)._M_p;
  pcVar2 = (separator->_M_dataplus)._M_p;
  _Var3 = std::
          __find_end<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (pcVar1,pcVar1 + path->_M_string_length,pcVar2,
                     pcVar2 + separator->_M_string_length);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_50,(path->_M_dataplus)._M_p,_Var3._M_current);
  setPath(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  pcVar4 = (path->_M_dataplus)._M_p + path->_M_string_length;
  if (_Var3._M_current + (_Var3._M_current != pcVar4) == pcVar4) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    setFile(this,&local_50);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>();
    setFile(this,&local_50);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

fs::Path::Path(std::string const& path, std::string const& separator) :
    _complete(path),
    _separator(separator)
{
  auto sep_path = std::find_end(path.begin(), path.end(),
                                separator.begin(), separator.end());

  setPath( { path.begin(), sep_path });
  if (sep_path != path.end())
    ++sep_path;
  if (sep_path != path.end())
	  setFile({ sep_path, path.end() });
  else
	  setFile("");
}